

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall
Parser::tokenizeFile
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data_in,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *data_out)

{
  byte bVar1;
  pointer pcVar2;
  long lVar3;
  pointer pvVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *pvVar8;
  pointer puVar9;
  pointer puVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  pointer pbVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *a;
  _Alloc_hider _Var15;
  pointer pvVar16;
  string lineBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_80;
  byte *local_78;
  ulong local_70;
  string local_68;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *local_48;
  pointer local_40;
  pointer local_38;
  
  pbVar14 = (data_in->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (data_in->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pvVar8 = (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            *)data_out;
  if (pbVar14 != local_40) {
    do {
      local_48 = pvVar8;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar2 = (pbVar14->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + pbVar14->_M_string_length);
      fixSpacing(this,&local_68);
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      std::
      vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
      ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)data_out,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_a8);
      local_38 = pbVar14;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      lVar3 = *(long *)((long)data_out + 8);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
      local_80 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (lVar3 + -0x18);
      local_78 = (byte *)local_68._M_string_length;
      if ((byte *)local_68._M_string_length != (byte *)0x0) {
        local_78 = (byte *)(local_68._M_string_length + (long)local_68._M_dataplus._M_p);
        bVar7 = false;
        bVar6 = false;
        iVar13 = 0;
        iVar12 = 0;
        _Var15._M_p = local_68._M_dataplus._M_p;
        do {
          puVar9 = (this->seperatorTokens).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar10 = (this->seperatorTokens).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (puVar10 == puVar9) {
LAB_0010d3a0:
            std::__cxx11::string::push_back((char)&local_a8);
          }
          else {
            uVar11 = 0;
            local_70 = 0;
            do {
              bVar1 = *_Var15._M_p;
              if (bVar1 < 0x29) {
                if (bVar1 == 0x22) {
                  bVar7 = (bool)(bVar7 ^ 1);
                }
                else {
                  if (bVar1 != 0x28) goto LAB_0010d302;
                  iVar12 = iVar12 + 1;
                }
                bVar6 = true;
              }
              else if (bVar1 == 0x29) {
                iVar12 = iVar12 + -1;
                if (iVar12 == 0) {
                  bVar6 = false;
                }
              }
              else if (bVar1 == 0x5b) {
                iVar13 = iVar13 + 1;
              }
              else if (bVar1 == 0x5d) {
                iVar13 = iVar13 + -1;
              }
LAB_0010d302:
              if ((((bVar7) || ((int)(char)bVar1 != (uint)puVar9[uVar11])) || (bVar6)) ||
                 (iVar13 != 0)) {
                if (((bVar6) && (bVar1 == 0x28)) && (iVar12 == 1)) {
                  if (local_a8._M_string_length != 0) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string&>(local_80,&local_a8);
                  }
                  goto LAB_0010d366;
                }
              }
              else {
                local_70 = CONCAT71((int7)((ulong)puVar9 >> 8),1);
                if (local_a8._M_string_length != 0) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>(local_80,&local_a8);
                }
LAB_0010d366:
                local_a8._M_string_length = 0;
                *local_a8._M_dataplus._M_p = '\0';
                puVar9 = (this->seperatorTokens).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                puVar10 = (this->seperatorTokens).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                uVar11 = (ulong)(uint)((int)puVar10 - (int)puVar9);
              }
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (uVar11 < (ulong)((long)puVar10 - (long)puVar9));
            if (((local_70 & 1) == 0) || (bVar7)) goto LAB_0010d3a0;
          }
          _Var15._M_p = _Var15._M_p + 1;
        } while ((byte *)_Var15._M_p != local_78);
      }
      if (local_a8._M_string_length != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>(local_80,&local_a8);
      }
      pbVar14 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      data_out = (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pbVar14 = pbVar14 + 1;
      pvVar8 = local_48;
    } while (pbVar14 != local_40);
  }
  pvVar4 = *(pointer *)((long)data_out + 8);
  for (pvVar16 = *(pointer *)data_out; pvVar16 != pvVar4; pvVar16 = pvVar16 + 1) {
    pbVar5 = (pvVar16->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar14 = (pvVar16->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar5;
        pbVar14 = pbVar14 + 1) {
      processEscapeSequences(this,pbVar14);
    }
  }
  return;
}

Assistant:

void Parser::tokenizeFile(const std::vector<std::string>& data_in, std::vector<std::vector<std::string>>& data_out)
{
    for(auto line : data_in) //Iterate through each line
    {
        fixSpacing(line);
        data_out.emplace_back(std::vector<std::string>());
        std::vector<std::string> &currentLine = data_out.back();
        std::string lineBuffer = "";
        bool isQuotationOpen = false;
        bool isBracketOpen = false;
        int squareBracketDepth = 0;
        unsigned int bracketDepth = 0;
        for(const auto &c : line) //Iterate through each character in each line
        {
            bool isSeperator = false;
            for(unsigned int a = 0; a < seperatorTokens.size(); a++) //Check to see if it's a split token
            {
                if(c == '"')
                {
                    isQuotationOpen = !isQuotationOpen;
                    isBracketOpen = true;
                }
                else if(c == '(')
                {
                    bracketDepth++;
                    isBracketOpen = true;
                }
                else if(c == ')')
                {
                    bracketDepth--;
                    if(bracketDepth == 0)
                        isBracketOpen = false;
                }
                else if(c == '[')
                    squareBracketDepth++;
                else if(c == ']')
                    squareBracketDepth--;
                if(!isQuotationOpen && c == seperatorTokens[a] && !isBracketOpen && squareBracketDepth == 0) //If it is, store the buffered word
                {
                    if(!lineBuffer.empty())
                        currentLine.emplace_back(lineBuffer);
                    lineBuffer.clear();
                    isSeperator = true;
                    a = seperatorTokens.size();
                }
                else if(isBracketOpen && c == '(' && bracketDepth == 1)
                {
                    if(!lineBuffer.empty())
                        currentLine.emplace_back(lineBuffer);
                    lineBuffer.clear();
                    a = seperatorTokens.size();
                }
            }
            if(!isSeperator || isQuotationOpen) //If not a separator, add to buffered word
            {
                lineBuffer += c;
            }
        }
        if(!lineBuffer.empty())
            currentLine.emplace_back(lineBuffer);
    }

    //Process escape sequences
    for(auto &a : data_out)
    {
        for(auto &b : a)
        {
            processEscapeSequences(b);
        }
    }
}